

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void __thiscall
EthBasePort::make_qwrite_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,quadlet_t data,uint tl)

{
  uint32_t uVar1;
  
  make_1394_header(this,packet,node,addr,0,tl);
  packet[3] = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  uVar1 = crc32(0,packet,0x10);
  uVar1 = BitReverse32(uVar1);
  packet[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return;
}

Assistant:

void EthBasePort::make_qwrite_packet(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned int tl)
{
    make_1394_header(packet, node, addr, EthBasePort::QWRITE, tl);
    // quadlet data
    packet[3] = bswap_32(data);
    // CRC
    packet[4] = bswap_32(BitReverse32(crc32(0U, (void*)packet, FW_QWRITE_SIZE-FW_CRC_SIZE)));
}